

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall
Catch::TeamCityReporter::testCaseEnded(TeamCityReporter *this,TestCaseStats *testCaseStats)

{
  TestCaseInfo *pTVar1;
  ostream *poVar2;
  size_type in_RCX;
  StringRef str;
  StringRef str_00;
  StringRef str_01;
  StringRef str_02;
  StringRef str_03;
  string local_68;
  string local_48;
  
  (this->super_StreamingReporterBase).currentTestCaseInfo = (TestCaseInfo *)0x0;
  pTVar1 = testCaseStats->testInfo;
  if ((testCaseStats->stdOut)._M_string_length != 0) {
    poVar2 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"##teamcity[testStdOut name=\'",0x1c);
    str.m_size = in_RCX;
    str.m_start = (char *)(pTVar1->name)._M_string_length;
    (anonymous_namespace)::escape_abi_cxx11_
              (&local_68,(_anonymous_namespace_ *)(pTVar1->name)._M_dataplus._M_p,str);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' out=\'",7);
    str_00.m_size = in_RCX;
    str_00.m_start = (char *)(testCaseStats->stdOut)._M_string_length;
    (anonymous_namespace)::escape_abi_cxx11_
              (&local_48,(_anonymous_namespace_ *)(testCaseStats->stdOut)._M_dataplus._M_p,str_00);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_48._M_dataplus._M_p,local_48._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\']\n",3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if ((testCaseStats->stdErr)._M_string_length != 0) {
    poVar2 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"##teamcity[testStdErr name=\'",0x1c);
    str_01.m_size = in_RCX;
    str_01.m_start = (char *)(pTVar1->name)._M_string_length;
    (anonymous_namespace)::escape_abi_cxx11_
              (&local_68,(_anonymous_namespace_ *)(pTVar1->name)._M_dataplus._M_p,str_01);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_68._M_dataplus._M_p,local_68._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' out=\'",7);
    str_02.m_size = in_RCX;
    str_02.m_start = (char *)(testCaseStats->stdErr)._M_string_length;
    (anonymous_namespace)::escape_abi_cxx11_
              (&local_48,(_anonymous_namespace_ *)(testCaseStats->stdErr)._M_dataplus._M_p,str_02);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar2,local_48._M_dataplus._M_p,local_48._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\']\n",3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  poVar2 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"##teamcity[testFinished name=\'",0x1e);
  str_03.m_size = in_RCX;
  str_03.m_start = (char *)(pTVar1->name)._M_string_length;
  (anonymous_namespace)::escape_abi_cxx11_
            (&local_68,(_anonymous_namespace_ *)(pTVar1->name)._M_dataplus._M_p,str_03);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_68._M_dataplus._M_p,local_68._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\' duration=\'",0xc);
  std::chrono::_V2::system_clock::now();
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\']\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  std::ostream::flush();
  return;
}

Assistant:

void TeamCityReporter::testCaseEnded(TestCaseStats const& testCaseStats) {
        StreamingReporterBase::testCaseEnded(testCaseStats);
        auto const& testCaseInfo = *testCaseStats.testInfo;
        if (!testCaseStats.stdOut.empty())
            m_stream << "##teamcity[testStdOut name='"
            << escape(testCaseInfo.name)
            << "' out='" << escape(testCaseStats.stdOut) << "']\n";
        if (!testCaseStats.stdErr.empty())
            m_stream << "##teamcity[testStdErr name='"
            << escape(testCaseInfo.name)
            << "' out='" << escape(testCaseStats.stdErr) << "']\n";
        m_stream << "##teamcity[testFinished name='"
            << escape(testCaseInfo.name) << "' duration='"
            << m_testTimer.getElapsedMilliseconds() << "']\n";
        m_stream.flush();
    }